

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::TriangleDraw::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 310 es                               \nflat out mediump vec2 texcoords;              \nin mediump vec4 Vertex;                       \nvoid main() {                                 \n   gl_Position = Vertex;                      \n   texcoords = (Vertex.xy + vec2(1.0)) / 2.0; \n}\n"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 310 es                               \n"
			   "flat out mediump vec2 texcoords;              \n"
			   "in mediump vec4 Vertex;                       \n"
			   "void main() {                                 \n"
			   "   gl_Position = Vertex;                      \n"
			   "   texcoords = (Vertex.xy + vec2(1.0)) / 2.0; \n"
			   "}\n";
	}